

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_impl.h
# Opt level: O2

atoms * __thiscall
c74::min::object_base::try_call
          (atoms *__return_storage_ptr__,object_base *this,string *name,atoms *args)

{
  iterator iVar1;
  
  iVar1 = Catch::clara::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_messages)._M_h,name);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    (__return_storage_ptr__->super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (**(code **)**(undefined8 **)
                  ((long)iVar1.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>,_true>
                         ._M_cur + 0x28))
              (__return_storage_ptr__,
               *(undefined8 **)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>,_true>
                       ._M_cur + 0x28),args,0xffffffffffffffff);
  }
  return __return_storage_ptr__;
}

Assistant:

atoms object_base::try_call(const std::string& name, const atoms& args)
{
    auto found_message = m_messages.find(name);
    if (found_message != m_messages.end()) {
        return (*found_message->second)(args);
    }
    return {};
}